

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateOneofCaseDefinition
          (Generator *this,GeneratorOptions *options,Printer *printer,OneofDescriptor *oneof)

{
  int iVar1;
  OneofDescriptor *pOVar2;
  Printer *this_00;
  bool bVar3;
  uint uVar4;
  GeneratorOptions *pGVar5;
  string *psVar6;
  FieldDescriptor *pFVar7;
  Descriptor *descriptor;
  OneofDescriptor *oneof_00;
  FieldDescriptor *field;
  OneofDescriptor *oneof_01;
  OneofDescriptor *oneof_02;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  string local_68;
  string local_48;
  OneofDescriptor *local_28;
  OneofDescriptor *oneof_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = oneof;
  oneof_local = (OneofDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  pGVar5 = (GeneratorOptions *)OneofDescriptor::containing_type(oneof);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,pGVar5,(Descriptor *)oneof);
  (anonymous_namespace)::JSOneofName_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)local_28,oneof_00);
  psVar6 = OneofDescriptor::name_abi_cxx11_(local_28);
  anon_unknown_0::ToEnumCase((string *)local_98,psVar6);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,
             "/**\n * @enum {number}\n */\n$classname$.$oneof$Case = {\n  $upcase$_NOT_SET: 0",
             (char (*) [10])0x77c586,&local_48,(char (*) [6])0x7c9cc7,&local_68,
             (char (*) [7])"upcase",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  local_9c = 0;
  while( true ) {
    iVar1 = local_9c;
    uVar4 = OneofDescriptor::field_count(local_28);
    this_00 = printer_local;
    pOVar2 = oneof_local;
    descriptor = (Descriptor *)(ulong)uVar4;
    if ((int)uVar4 <= iVar1) break;
    pFVar7 = OneofDescriptor::field(local_28,local_9c);
    bVar3 = anon_unknown_0::IgnoreField(pFVar7);
    pOVar2 = oneof_local;
    if (!bVar3) {
      pFVar7 = OneofDescriptor::field(local_28,local_9c);
      psVar6 = FieldDescriptor::name_abi_cxx11_(pFVar7);
      anon_unknown_0::ToEnumCase(&local_c0,psVar6);
      pFVar7 = OneofDescriptor::field(local_28,local_9c);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_e0,(_anonymous_namespace_ *)pFVar7,field);
      io::Printer::Print<char[7],std::__cxx11::string,char[7],std::__cxx11::string>
                ((Printer *)pOVar2,",\n  $upcase$: $number$",(char (*) [7])"upcase",&local_c0,
                 (char (*) [7])0x79279d,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      pOVar2 = oneof_local;
      pFVar7 = OneofDescriptor::field(local_28,local_9c);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>((Printer *)pOVar2,"upcase",pFVar7);
    }
    local_9c = local_9c + 1;
  }
  pGVar5 = (GeneratorOptions *)OneofDescriptor::containing_type(local_28);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_100,(_anonymous_namespace_ *)this_00,pGVar5,descriptor);
  (anonymous_namespace)::JSOneofName_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)local_28,oneof_01);
  (anonymous_namespace)::JSOneofIndex_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)local_28,oneof_02);
  io::Printer::
  Print<char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string>
            ((Printer *)pOVar2,
             "\n};\n\n/**\n * @return {$class$.$oneof$Case}\n */\n$class$.prototype.get$oneof$Case = function() {\n  return /** @type {$class$.$oneof$Case} */(jspb.Message.computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n};\n\n"
             ,(char (*) [6])0x77b9ef,&local_100,(char (*) [6])0x7c9cc7,&local_120,
             (char (*) [11])"oneofindex",&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

void Generator::GenerateOneofCaseDefinition(
    const GeneratorOptions& options, io::Printer* printer,
    const OneofDescriptor* oneof) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$classname$.$oneof$Case = {\n"
      "  $upcase$_NOT_SET: 0",
      "classname", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "upcase", ToEnumCase(oneof->name()));

  for (int i = 0; i < oneof->field_count(); i++) {
    if (IgnoreField(oneof->field(i))) {
      continue;
    }

    printer->Print(
        ",\n"
        "  $upcase$: $number$",
        "upcase", ToEnumCase(oneof->field(i)->name()), "number",
        JSFieldIndex(oneof->field(i)));
    printer->Annotate("upcase", oneof->field(i));
  }

  printer->Print(
      "\n"
      "};\n"
      "\n"
      "/**\n"
      " * @return {$class$.$oneof$Case}\n"
      " */\n"
      "$class$.prototype.get$oneof$Case = function() {\n"
      "  return /** @type {$class$.$oneof$Case} */(jspb.Message."
      "computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n"
      "};\n"
      "\n",
      "class", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "oneofindex", JSOneofIndex(oneof));
}